

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O0

bool __thiscall FIX::DataDictionary::getFieldType(DataDictionary *this,int field,Type *type)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_38;
  _Self local_30;
  const_iterator i;
  Type *type_local;
  DataDictionary *pDStack_18;
  int field_local;
  DataDictionary *this_local;
  
  i._M_node = (_Base_ptr)type;
  type_local._4_4_ = field;
  pDStack_18 = this;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<int,_FIX::TYPE::Type,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::TYPE::Type>_>_>
       ::find(&this->m_fieldTypes,(key_type *)((long)&type_local + 4));
  local_38._M_node =
       (_Base_ptr)
       std::
       map<int,_FIX::TYPE::Type,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::TYPE::Type>_>_>
       ::end(&this->m_fieldTypes);
  bVar1 = std::operator==(&local_30,&local_38);
  if (!bVar1) {
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_int,_FIX::TYPE::Type>_>::operator->
                       (&local_30);
    (i._M_node)->_M_color = ppVar2->second;
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool getFieldType(int field, FIX::TYPE::Type &type) const {
    FieldTypes::const_iterator i = m_fieldTypes.find(field);
    if (i == m_fieldTypes.end()) {
      return false;
    }
    type = i->second;
    return true;
  }